

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetNavFocusScope(ImGuiID focus_scope_id)

{
  ImGuiContext *pIVar1;
  uint uVar2;
  ImGuiID in_EDI;
  ImGuiWindow *window;
  int n;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  ImGuiWindow *local_28;
  int local_14;
  
  pIVar1 = GImGui;
  GImGui->NavFocusScopeId = in_EDI;
  ImVector<ImGuiFocusScopeData>::resize
            ((ImVector<ImGuiFocusScopeData> *)
             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc
            );
  if (in_EDI != 0) {
    if (in_EDI == pIVar1->CurrentFocusScopeId) {
      local_14 = (pIVar1->FocusScopeStack).Size;
      while( true ) {
        local_14 = local_14 + -1;
        uVar2 = in_stack_ffffffffffffffcc & 0xffffff;
        if (-1 < local_14) {
          uVar2 = CONCAT13((pIVar1->FocusScopeStack).Data[local_14].WindowID ==
                           pIVar1->CurrentWindow->ID,(int3)in_stack_ffffffffffffffcc);
        }
        in_stack_ffffffffffffffcc = uVar2;
        if ((char)(in_stack_ffffffffffffffcc >> 0x18) == '\0') break;
        ImVector<ImGuiFocusScopeData>::push_back
                  ((ImVector<ImGuiFocusScopeData> *)
                   CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   (ImGuiFocusScopeData *)
                   CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      }
    }
    else {
      if (in_EDI != pIVar1->NavWindow->NavRootFocusScopeId) {
        return;
      }
      ImVector<ImGuiFocusScopeData>::push_back
                ((ImVector<ImGuiFocusScopeData> *)
                 CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 (ImGuiFocusScopeData *)
                 CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    }
    for (local_28 = pIVar1->NavWindow->ParentWindowForFocusRoute; local_28 != (ImGuiWindow *)0x0;
        local_28 = local_28->ParentWindowForFocusRoute) {
      ImVector<ImGuiFocusScopeData>::push_back
                ((ImVector<ImGuiFocusScopeData> *)
                 CONCAT44(local_28->ID,local_28->NavRootFocusScopeId),
                 (ImGuiFocusScopeData *)
                 CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    }
  }
  return;
}

Assistant:

void ImGui::SetNavFocusScope(ImGuiID focus_scope_id)
{
    ImGuiContext& g = *GImGui;
    g.NavFocusScopeId = focus_scope_id;
    g.NavFocusRoute.resize(0); // Invalidate
    if (focus_scope_id == 0)
        return;
    IM_ASSERT(g.NavWindow != NULL);

    // Store current path (in reverse order)
    if (focus_scope_id == g.CurrentFocusScopeId)
    {
        // Top of focus stack contains local focus scopes inside current window
        for (int n = g.FocusScopeStack.Size - 1; n >= 0 && g.FocusScopeStack.Data[n].WindowID == g.CurrentWindow->ID; n--)
            g.NavFocusRoute.push_back(g.FocusScopeStack.Data[n]);
    }
    else if (focus_scope_id == g.NavWindow->NavRootFocusScopeId)
        g.NavFocusRoute.push_back({ focus_scope_id, g.NavWindow->ID });
    else
        return;

    // Then follow on manually set ParentWindowForFocusRoute field (#6798)
    for (ImGuiWindow* window = g.NavWindow->ParentWindowForFocusRoute; window != NULL; window = window->ParentWindowForFocusRoute)
        g.NavFocusRoute.push_back({ window->NavRootFocusScopeId, window->ID });
    IM_ASSERT(g.NavFocusRoute.Size < 100); // Maximum depth is technically 251 as per CalcRoutingScore(): 254 - 3
}